

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  TracerouteRunner *this;
  pointer pbVar4;
  thread t2;
  thread t1;
  TracerouteRunner *t;
  code *local_280;
  undefined8 local_278;
  string url;
  byte abStack_250 [352];
  parser locate_route;
  
  argh::parser::parser(&locate_route,argc,argv,1);
  url._M_dataplus._M_p = "-h";
  url._M_string_length = (size_type)anon_var_dwarf_7922;
  bVar2 = std::
          any_of<char_const*const*,argh::parser::operator[](std::initializer_list<char_const*const>)const::_lambda(char_const*)_1_>
                    ((char **)&url,(char **)&url.field_2._M_allocated_capacity,&locate_route);
  if (bVar2) {
    std::operator<<((ostream *)&std::cout,
                    "locateroute - Get location information of the traceroute hops\n\n");
    std::operator<<((ostream *)&std::cout,"USAGE: \n\t locateroute [ip or domain name]\n");
    std::operator<<((ostream *)&std::cout,"FLAGS: \n\t -h, --help  Display Help\n");
  }
  else {
    argh::parser::operator()((string_stream *)&url,&locate_route,1);
    bVar1 = abStack_250[*(long *)(url._M_dataplus._M_p + -0x18)];
    std::__cxx11::istringstream::~istringstream((istringstream *)&url);
    if ((bVar1 & 5) == 0) {
      pbVar4 = locate_route.pos_args_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
      if ((ulong)((long)locate_route.pos_args_.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)locate_route.pos_args_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
        pbVar4 = &locate_route.empty_;
      }
      std::__cxx11::string::string((string *)&url,(string *)pbVar4);
      this = (TracerouteRunner *)operator_new(0x68);
      TracerouteRunner::TracerouteRunner(this,&url);
      local_280 = TracerouteRunner::fetch_results;
      local_278 = 0;
      t = this;
      std::thread::thread<void(TracerouteRunner::*)(),TracerouteRunner*&,void>
                (&t1,(type *)&local_280,&t);
      local_280 = TracerouteRunner::print_output;
      local_278 = 0;
      std::thread::thread<void(TracerouteRunner::*)(),TracerouteRunner*&,void>
                (&t2,(type *)&local_280,&t);
      std::thread::join();
      std::thread::join();
      std::thread::~thread(&t2);
      std::thread::~thread(&t1);
      std::__cxx11::string::~string((string *)&url);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"Enter ip address or domain name");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  argh::parser::~parser(&locate_route);
  return 0;
}

Assistant:

int main(int argc, char** argv) {

	argh::parser locate_route(argc, argv);

	if(locate_route[{"-h", "--help"}]) {
		std::cout << "locateroute - Get location information of the traceroute hops\n\n";
		std::cout << "USAGE: \n\t locateroute [ip or domain name]\n";
		std::cout << "FLAGS: \n\t -h, --help  Display Help\n";
	} else {
		if(locate_route(1)) {
			std::string url = locate_route[1];
			auto *t = new TracerouteRunner(url);

			std::thread t1(&TracerouteRunner::fetch_results, t);
			std::thread t2(&TracerouteRunner::print_output, t);

			t1.join();
			t2.join();
		} else {
			std::cout << "Enter ip address or domain name" << std::endl;
		}
	}

	return 0;
}